

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O0

void voutf(GlobalConfig *config,char *prefix,char *fmt,__va_list_tag *ap)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  long local_50;
  size_t cut;
  char *print_buffer;
  char *ptr;
  size_t len;
  size_t width;
  __va_list_tag *ap_local;
  char *fmt_local;
  char *prefix_local;
  GlobalConfig *config_local;
  
  sVar3 = strlen(prefix);
  lVar1 = -sVar3;
  if (((config->mute & 1U) == 0) && (__s = (char *)curl_mvaprintf(fmt,ap), __s != (char *)0x0)) {
    ptr = (char *)strlen(__s);
    print_buffer = __s;
    while (ptr != (char *)0x0) {
      fputs(prefix,(FILE *)config->errors);
      if ((char *)(lVar1 + 0x4fU) < ptr) {
        for (local_50 = lVar1 + 0x4e; iVar2 = Curl_isspace((uint)(byte)print_buffer[local_50]),
            iVar2 == 0 && local_50 != 0; local_50 = local_50 + -1) {
        }
        if (local_50 == 0) {
          local_50 = lVar1 + 0x4e;
        }
        fwrite(print_buffer,local_50 + 1,1,(FILE *)config->errors);
        fputs("\n",(FILE *)config->errors);
        print_buffer = print_buffer + local_50 + 1;
        ptr = ptr + -(local_50 + 1);
      }
      else {
        fputs(print_buffer,(FILE *)config->errors);
        ptr = (char *)0x0;
      }
    }
    curl_free(__s);
  }
  return;
}

Assistant:

static void voutf(struct GlobalConfig *config,
                  const char *prefix,
                  const char *fmt,
                  va_list ap)
{
  size_t width = (79 - strlen(prefix));
  if(!config->mute) {
    size_t len;
    char *ptr;
    char *print_buffer;

    print_buffer = curlx_mvaprintf(fmt, ap);
    if(!print_buffer)
      return;
    len = strlen(print_buffer);

    ptr = print_buffer;
    while(len > 0) {
      fputs(prefix, config->errors);

      if(len > width) {
        size_t cut = width-1;

        while(!ISSPACE(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = width-1;

        (void)fwrite(ptr, cut + 1, 1, config->errors);
        fputs("\n", config->errors);
        ptr += cut + 1; /* skip the space too */
        len -= cut + 1;
      }
      else {
        fputs(ptr, config->errors);
        len = 0;
      }
    }
    curl_free(print_buffer);
  }
}